

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

tjhandle tjInitCompress(void)

{
  void *__s;
  long *in_FS_OFFSET;
  tjinstance *this;
  tjinstance *in_stack_fffffffffffffff8;
  tjhandle pvVar1;
  
  __s = malloc(0x6d8);
  if (__s == (void *)0x0) {
    snprintf((char *)(*in_FS_OFFSET + -0xd0),200,"tjInitCompress(): Memory allocation failure");
    pvVar1 = (tjhandle)0x0;
  }
  else {
    memset(__s,0,0x6d8);
    snprintf((char *)((long)__s + 0x608),200,"No error");
    pvVar1 = _tjInitCompress(in_stack_fffffffffffffff8);
  }
  return pvVar1;
}

Assistant:

DLLEXPORT tjhandle tjInitCompress(void)
{
  tjinstance *this = NULL;

  if ((this = (tjinstance *)malloc(sizeof(tjinstance))) == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjInitCompress(): Memory allocation failure");
    return NULL;
  }
  MEMZERO(this, sizeof(tjinstance));
  snprintf(this->errStr, JMSG_LENGTH_MAX, "No error");
  return _tjInitCompress(this);
}